

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  pointer *ppbVar1;
  pointer pbVar2;
  InternalRunDeathTestFlag *pIVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long *plVar8;
  undefined8 *puVar9;
  int *piVar10;
  void *__addr;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined8 *extraout_RAX_01;
  undefined8 *extraout_RAX_02;
  undefined8 *extraout_RAX_03;
  undefined8 *extraout_RAX_04;
  undefined8 *extraout_RAX_05;
  undefined8 *extraout_RAX_06;
  undefined8 extraout_RAX_07;
  pointer *pppcVar11;
  __sighandler_t p_Var12;
  long *plVar13;
  _func_void *p_Var14;
  ulong *puVar15;
  ulong *puVar16;
  size_type *psVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  ulong *extraout_RDX_00;
  ulong *extraout_RDX_01;
  ulong *extraout_RDX_02;
  ulong *extraout_RDX_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_04;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_05;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RDX_06;
  ulong uVar19;
  pointer pbVar20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  long lVar21;
  pointer ppcVar22;
  undefined8 uVar23;
  ulong uVar24;
  const_iterator __position;
  size_t __len;
  _union_1457 local_310;
  sigaction ignore_sigprof_action;
  string filter_flag;
  long local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  size_type *local_238;
  string internal_flag;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  undefined1 local_180 [8];
  ExecDeathTestArgs args_2;
  int local_15c;
  undefined1 auStack_158 [4];
  int death_test_index;
  Arguments args;
  int local_138;
  int local_134;
  int pipe_fd [2];
  size_type local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_120;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  ulong *local_70;
  long local_68;
  ulong local_60;
  undefined8 uStack_58;
  pointer *local_50;
  long local_48;
  pointer local_40;
  long lStack_38;
  
  UnitTest::GetInstance();
  pIVar3 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_).ptr_;
  local_15c = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).
              death_test_count_;
  if (pIVar3 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar3->write_fd_;
    return EXECUTE_TEST;
  }
  iVar5 = pipe(&local_138);
  if (iVar5 == -1) {
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CHECK failed: File ","");
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    local_50 = (pointer *)*puVar9;
    pppcVar11 = (pointer *)(puVar9 + 2);
    if (local_50 == pppcVar11) {
      local_40 = *pppcVar11;
      lStack_38 = puVar9[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *pppcVar11;
    }
    local_48 = puVar9[1];
    *puVar9 = pppcVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (ulong *)*plVar8;
    puVar16 = (ulong *)(plVar8 + 2);
    if (local_90 == puVar16) {
      local_80 = *puVar16;
      lStack_78 = plVar8[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *puVar16;
    }
    local_88 = plVar8[1];
    *plVar8 = (long)puVar16;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    local_110._M_dataplus._M_p._0_4_ = 0x46b;
    StreamableToString<int>(&local_d0,(int *)&local_110);
    uVar24 = 0xf;
    if (local_90 != &local_80) {
      uVar24 = local_80;
    }
    if (uVar24 < local_d0._M_string_length + local_88) {
      uVar23 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar23 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar23 < local_d0._M_string_length + local_88) goto LAB_00133228;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_90);
    }
    else {
LAB_00133228:
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)*puVar9;
    puVar16 = puVar9 + 2;
    if ((ulong *)local_b0._M_dataplus._M_p == puVar16) {
      local_b0.field_2._M_allocated_capacity = *puVar16;
      local_b0.field_2._8_8_ = puVar9[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar16;
    }
    local_b0._M_string_length = puVar9[1];
    *puVar9 = puVar16;
    puVar9[1] = 0;
    *(undefined1 *)puVar16 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_310.sa_handler = (__sighandler_t)*plVar8;
    p_Var12 = (__sighandler_t)(plVar8 + 2);
    if (local_310.sa_handler == p_Var12) {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var12;
      ignore_sigprof_action.sa_mask.__val[1] = plVar8[3];
      local_310 = (_union_1457)&ignore_sigprof_action.sa_mask;
    }
    else {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var12;
    }
    ignore_sigprof_action.__sigaction_handler =
         *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar8 + 1);
    *plVar8 = (long)p_Var12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
    internal_flag.field_2._8_8_ = *puVar9;
    puVar16 = puVar9 + 2;
    if ((ulong *)internal_flag.field_2._8_8_ == puVar16) {
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar16;
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar9[3];
      internal_flag.field_2._8_8_ =
           &args_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar16;
    }
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar9[1];
    *puVar9 = puVar16;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    DeathTestAbort((string *)((long)&internal_flag.field_2 + 8));
    puVar9 = extraout_RAX_02;
    internal_flag.field_2._8_8_ = extraout_RDX_02;
LAB_00133c27:
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar16;
  }
  else {
    iVar5 = fcntl(local_134,2,0);
    if (iVar5 != -1) {
      local_70 = &local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"--","");
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
      pppcVar11 = (pointer *)(plVar8 + 2);
      if ((pointer *)*plVar8 == pppcVar11) {
        local_40 = *pppcVar11;
        lStack_38 = plVar8[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *pppcVar11;
        local_50 = (pointer *)*plVar8;
      }
      local_48 = plVar8[1];
      *plVar8 = (long)pppcVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
      puVar16 = (ulong *)(plVar8 + 2);
      if ((ulong *)*plVar8 == puVar16) {
        local_80 = *puVar16;
        lStack_78 = plVar8[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *puVar16;
        local_90 = (ulong *)*plVar8;
      }
      local_88 = plVar8[1];
      *plVar8 = (long)puVar16;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      psVar17 = (size_type *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar17) {
        local_b0.field_2._M_allocated_capacity = *psVar17;
        local_b0.field_2._8_8_ = plVar8[3];
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar17;
        local_b0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_b0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar17;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_310.sa_handler = (__sighandler_t)&ignore_sigprof_action.sa_mask;
      p_Var12 = (__sighandler_t)(plVar8 + 2);
      if ((__sighandler_t)*plVar8 == p_Var12) {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var12;
        ignore_sigprof_action.sa_mask.__val[1] = plVar8[3];
      }
      else {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var12;
        local_310.sa_handler = (__sighandler_t)*plVar8;
      }
      ignore_sigprof_action.__sigaction_handler =
           *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar8 + 1);
      *plVar8 = (long)p_Var12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_310);
      internal_flag.field_2._8_8_ =
           &args_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      plVar13 = plVar8 + 2;
      if ((long *)*plVar8 == plVar13) {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar13;
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar8[3];
      }
      else {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar13;
        internal_flag.field_2._8_8_ = (long *)*plVar8;
      }
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar8[1];
      *plVar8 = (long)plVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append(internal_flag.field_2._M_local_buf + 8);
      ignore_sigprof_action.sa_restorer = (_func_void *)&filter_flag._M_string_length;
      p_Var14 = (_func_void *)(plVar8 + 2);
      if ((_func_void *)*plVar8 == p_Var14) {
        filter_flag._M_string_length = *(size_type *)p_Var14;
        filter_flag.field_2._M_allocated_capacity = plVar8[3];
      }
      else {
        filter_flag._M_string_length = *(size_type *)p_Var14;
        ignore_sigprof_action.sa_restorer = (_func_void *)*plVar8;
      }
      filter_flag._M_dataplus._M_p = (pointer)plVar8[1];
      *plVar8 = (long)p_Var14;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      if ((pointer *)internal_flag.field_2._8_8_ !=
          &args_1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)internal_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      if ((__sigset_t *)local_310.sa_handler != &ignore_sigprof_action.sa_mask) {
        operator_delete(local_310.sa_handler,ignore_sigprof_action.sa_mask.__val[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,(long)local_40 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      pipe_fd = (int  [2])&local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)pipe_fd,"--","");
      plVar8 = (long *)std::__cxx11::string::append((char *)pipe_fd);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      puVar16 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_f0.field_2._M_allocated_capacity = *puVar16;
        local_f0.field_2._8_8_ = plVar8[3];
      }
      else {
        local_f0.field_2._M_allocated_capacity = *puVar16;
        local_f0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_f0._M_string_length = plVar8[1];
      *plVar8 = (long)puVar16;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
      plVar13 = plVar8 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar13) {
        local_110.field_2._M_allocated_capacity = *plVar13;
        local_110.field_2._8_8_ = plVar8[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *plVar13;
        local_110._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_110._M_string_length = plVar8[1];
      *plVar8 = (long)plVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
      puVar16 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_d0.field_2._M_allocated_capacity = *puVar16;
        local_d0.field_2._8_8_ = plVar8[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar16;
        local_d0._M_dataplus._M_p = (pointer)*plVar8;
      }
      local_d0._M_string_length = plVar8[1];
      *plVar8 = (long)puVar16;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
      puVar16 = puVar9 + 2;
      if ((ulong *)*puVar9 == puVar16) {
        local_60 = *puVar16;
        uStack_58 = puVar9[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar16;
        local_70 = (ulong *)*puVar9;
      }
      local_68 = puVar9[1];
      *puVar9 = puVar16;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
      pppcVar11 = (pointer *)(plVar8 + 2);
      if ((pointer *)*plVar8 == pppcVar11) {
        local_40 = *pppcVar11;
        lStack_38 = plVar8[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *pppcVar11;
        local_50 = (pointer *)*plVar8;
      }
      local_48 = plVar8[1];
      *plVar8 = (long)pppcVar11;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      StreamableToString<int>((string *)auStack_158,&this->line_);
      ppcVar22 = (pointer)0xf;
      if (local_50 != &local_40) {
        ppcVar22 = local_40;
      }
      if (ppcVar22 <
          (pointer)((long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                          super__Vector_impl_data._M_start + local_48)) {
        ppcVar22 = (pointer)0xf;
        if ((pointer *)_auStack_158 !=
            &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
             super__Vector_impl_data._M_finish) {
          ppcVar22 = args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        }
        if (ppcVar22 <
            (pointer)((long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                            super__Vector_impl_data._M_start + local_48)) goto LAB_00131dfb;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)auStack_158,0,(char *)0x0,(ulong)local_50);
      }
      else {
LAB_00131dfb:
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_50,(ulong)_auStack_158);
      }
      local_90 = &local_80;
      puVar16 = puVar9 + 2;
      if ((ulong *)*puVar9 == puVar16) {
        local_80 = *puVar16;
        lStack_78 = puVar9[3];
      }
      else {
        local_80 = *puVar16;
        local_90 = (ulong *)*puVar9;
      }
      local_88 = puVar9[1];
      *puVar9 = puVar16;
      puVar9[1] = 0;
      *(undefined1 *)puVar16 = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      puVar16 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar16) {
        local_b0.field_2._M_allocated_capacity = *puVar16;
        local_b0.field_2._8_8_ = puVar9[3];
      }
      else {
        local_b0.field_2._M_allocated_capacity = *puVar16;
        local_b0._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_b0._M_string_length = puVar9[1];
      *puVar9 = puVar16;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      StreamableToString<int>((string *)local_180,&local_15c);
      uVar24 = CONCAT44(args_2.argv._4_4_,(int)args_2.argv) + local_b0._M_string_length;
      uVar23 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        uVar23 = local_b0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar23 < uVar24) {
        uVar19 = 0xf;
        if (local_180 != (undefined1  [8])&args_2.close_fd) {
          uVar19 = args_2._8_8_;
        }
        if (uVar19 < uVar24) goto LAB_00131f30;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)local_180,0,(char *)0x0,(ulong)local_b0._M_dataplus._M_p);
      }
      else {
LAB_00131f30:
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_180);
      }
      local_310.sa_handler = (__sighandler_t)&ignore_sigprof_action.sa_mask;
      p_Var12 = (__sighandler_t)(puVar9 + 2);
      if ((__sighandler_t)*puVar9 == p_Var12) {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var12;
        ignore_sigprof_action.sa_mask.__val[1] = puVar9[3];
      }
      else {
        ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var12;
        local_310.sa_handler = (__sighandler_t)*puVar9;
      }
      ignore_sigprof_action.__sigaction_handler =
           *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(puVar9 + 1);
      *puVar9 = p_Var12;
      puVar9[1] = 0;
      *p_Var12 = (__sighandler_t)0x0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_310);
      internal_flag.field_2._8_8_ =
           &args_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      plVar13 = plVar8 + 2;
      if ((long *)*plVar8 == plVar13) {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar13;
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)plVar8[3];
      }
      else {
        args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)*plVar13;
        internal_flag.field_2._8_8_ = (long *)*plVar8;
      }
      args_1.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)plVar8[1];
      *plVar8 = (long)plVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      StreamableToString<int>((string *)((long)&filter_flag.field_2 + 8),&local_134);
      pbVar2 = (pointer)((long)&((args_1.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                        local_250);
      pbVar20 = (pointer)0xf;
      if ((pointer *)internal_flag.field_2._8_8_ !=
          &args_1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar20 = args_1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      if (pbVar20 < pbVar2) {
        uVar23 = (pointer)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(filter_flag.field_2._12_4_,filter_flag.field_2._8_4_) != &local_248) {
          uVar23 = local_248._M_allocated_capacity;
        }
        if ((ulong)uVar23 < pbVar2) goto LAB_00132071;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)((long)&filter_flag.field_2 + 8),0,(char *)0x0,
                            internal_flag.field_2._8_8_);
      }
      else {
LAB_00132071:
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           (internal_flag.field_2._M_local_buf + 8,
                            CONCAT44(filter_flag.field_2._12_4_,filter_flag.field_2._8_4_));
      }
      local_238 = &internal_flag._M_string_length;
      psVar17 = puVar9 + 2;
      if ((size_type *)*puVar9 == psVar17) {
        internal_flag._M_string_length = *psVar17;
        internal_flag.field_2._M_allocated_capacity = puVar9[3];
      }
      else {
        internal_flag._M_string_length = *psVar17;
        local_238 = (size_type *)*puVar9;
      }
      internal_flag._M_dataplus._M_p = (pointer)puVar9[1];
      *puVar9 = psVar17;
      puVar9[1] = 0;
      *(undefined1 *)psVar17 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(filter_flag.field_2._12_4_,filter_flag.field_2._8_4_) != &local_248) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(filter_flag.field_2._12_4_,filter_flag.field_2._8_4_),
                        (ulong)(local_248._M_allocated_capacity + 1));
      }
      if ((pointer *)internal_flag.field_2._8_8_ !=
          &args_1.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
        operator_delete((void *)internal_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      if ((__sigset_t *)local_310.sa_handler != &ignore_sigprof_action.sa_mask) {
        operator_delete(local_310.sa_handler,ignore_sigprof_action.sa_mask.__val[0] + 1);
      }
      if (local_180 != (undefined1  [8])&args_2.close_fd) {
        operator_delete((void *)local_180,args_2._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90,local_80 + 1);
      }
      if ((pointer *)_auStack_158 !=
          &args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete(_auStack_158,
                        (long)args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl
                              .super__Vector_impl_data._M_finish + 1);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,(long)local_40 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (pipe_fd != (int  [2])&local_120) {
        operator_delete((void *)pipe_fd,local_120._M_allocated_capacity + 1);
      }
      Arguments::Arguments((Arguments *)auStack_158);
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&g_argvs_abi_cxx11_;
      if (g_injected_test_argvs_abi_cxx11_ !=
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        __x = g_injected_test_argvs_abi_cxx11_;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&internal_flag.field_2 + 8),__x);
      Arguments::AddArguments<std::__cxx11::string>
                ((Arguments *)auStack_158,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&internal_flag.field_2 + 8));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&internal_flag.field_2 + 8));
      __position._M_current =
           args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
           super__Vector_impl_data._M_start + -1;
      internal_flag.field_2._8_8_ = strdup((char *)ignore_sigprof_action.sa_restorer);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)auStack_158,__position,
                 (value_type *)((long)&internal_flag.field_2 + 8));
      ppbVar1 = &args_1.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      internal_flag.field_2._8_8_ = strdup((char *)local_238);
      std::vector<char_*,_std::allocator<char_*>_>::_M_insert_rval
                ((vector<char_*,_std::allocator<char_*>_> *)auStack_158,
                 (const_iterator)
                 (args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_start + -1),
                 (value_type *)((long)&internal_flag.field_2 + 8));
      internal_flag.field_2._8_8_ = ppbVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&internal_flag.field_2 + 8),"");
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if ((pointer *)internal_flag.field_2._8_8_ != ppbVar1) {
        operator_delete((void *)internal_flag.field_2._8_8_,
                        (ulong)((long)&((args_1.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish)->_M_dataplus).
                                       _M_p + 1));
      }
      CaptureStream(2,"stderr",(CapturedStream **)&g_captured_stderr);
      fflush((FILE *)0x0);
      local_180 = (undefined1  [8])_auStack_158;
      args_2.argv._0_4_ = local_138;
      memset(&local_310,0,0x98);
      sigemptyset((sigset_t *)&ignore_sigprof_action);
      local_310 = (_union_1457)0x1;
      do {
        iVar5 = sigaction(0x1b,(sigaction *)&local_310,
                          (sigaction *)((long)&internal_flag.field_2 + 8));
        cVar4 = FLAGS_gtest_death_test_use_fork;
        if (iVar5 != -1) {
          iVar5 = -1;
          if (FLAGS_gtest_death_test_use_fork == '\0') {
            if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') {
              AssumeRole();
            }
            uVar6 = getpagesize();
            __len = (size_t)(int)uVar6;
            __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
            if (__addr == (void *)0xffffffffffffffff) {
              local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_110,"CHECK failed: File ","");
              puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
              local_d0._M_dataplus._M_p = (pointer)*puVar9;
              puVar16 = puVar9 + 2;
              if ((ulong *)local_d0._M_dataplus._M_p == puVar16) {
                local_d0.field_2._M_allocated_capacity = *puVar16;
                local_d0.field_2._8_8_ = puVar9[3];
                local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              }
              else {
                local_d0.field_2._M_allocated_capacity = *puVar16;
              }
              local_d0._M_string_length = puVar9[1];
              *puVar9 = puVar16;
              puVar9[1] = 0;
              *(undefined1 *)(puVar9 + 2) = 0;
              puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
              local_70 = &local_60;
              puVar16 = (ulong *)*puVar9;
              puVar15 = puVar9 + 2;
              if (puVar16 != puVar15) goto LAB_0013354b;
              local_60 = *puVar15;
              uStack_58 = puVar9[3];
              goto LAB_00133556;
            }
            lVar21 = 0;
            if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
              lVar21 = __len - 0x40;
            }
            if ((0x40 < uVar6) && (((ulong)(lVar21 + (long)__addr) & 0x3f) == 0)) {
              iVar5 = clone(ExecDeathTestChildMain,(void *)(lVar21 + (long)__addr),0x11,local_180);
              iVar7 = munmap(__addr,__len);
              if (iVar7 != -1) goto LAB_0013250b;
              goto LAB_00132beb;
            }
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_110,"CHECK failed: File ","");
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
            local_d0._M_dataplus._M_p = (pointer)*puVar9;
            puVar16 = puVar9 + 2;
            if ((ulong *)local_d0._M_dataplus._M_p == puVar16) {
              local_d0.field_2._M_allocated_capacity = *puVar16;
              local_d0.field_2._8_8_ = puVar9[3];
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            }
            else {
              local_d0.field_2._M_allocated_capacity = *puVar16;
            }
            local_d0._M_string_length = puVar9[1];
            *puVar9 = puVar16;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
            local_70 = (ulong *)*puVar9;
            puVar16 = puVar9 + 2;
            if (local_70 == puVar16) {
              local_60 = *puVar16;
              uStack_58 = puVar9[3];
              local_70 = &local_60;
            }
            else {
              local_60 = *puVar16;
            }
            local_68 = puVar9[1];
            *puVar9 = puVar16;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            pipe_fd[0] = 0x442;
            StreamableToString<int>(&local_f0,pipe_fd);
            uVar24 = 0xf;
            if (local_70 != &local_60) {
              uVar24 = local_60;
            }
            if (uVar24 < local_f0._M_string_length + local_68) {
              uVar23 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                uVar23 = local_f0.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar23 < local_f0._M_string_length + local_68) goto LAB_00133674;
              puVar9 = (undefined8 *)
                       std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_70)
              ;
            }
            else {
LAB_00133674:
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)local_f0._M_dataplus._M_p);
            }
            local_50 = (pointer *)*puVar9;
            pppcVar11 = (pointer *)(puVar9 + 2);
            if (local_50 == pppcVar11) {
              local_40 = *pppcVar11;
              lStack_38 = puVar9[3];
              local_50 = &local_40;
            }
            else {
              local_40 = *pppcVar11;
            }
            local_48 = puVar9[1];
            *puVar9 = pppcVar11;
            puVar9[1] = 0;
            *(undefined1 *)pppcVar11 = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
            local_90 = (ulong *)*puVar9;
            puVar16 = puVar9 + 2;
            if (local_90 == puVar16) {
              local_80 = *puVar16;
              lStack_78 = puVar9[3];
              local_90 = &local_80;
            }
            else {
              local_80 = *puVar16;
            }
            local_88 = puVar9[1];
            *puVar9 = puVar16;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
            local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar9;
            psVar17 = puVar9 + 2;
            if (paVar18 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar17) goto LAB_00133e04;
            local_b0.field_2._M_allocated_capacity = *psVar17;
            local_b0.field_2._8_8_ = puVar9[3];
            goto LAB_00133e15;
          }
LAB_0013250b:
          if ((cVar4 == '\0') || (iVar5 = fork(), iVar5 != 0)) {
            goto LAB_00132527;
          }
          ExecDeathTestChildMain(local_180);
LAB_00132beb:
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_110,"CHECK failed: File ","");
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
          local_d0._M_dataplus._M_p = (pointer)*puVar9;
          puVar16 = puVar9 + 2;
          if ((ulong *)local_d0._M_dataplus._M_p == puVar16) {
            local_d0.field_2._M_allocated_capacity = *puVar16;
            local_d0.field_2._8_8_ = puVar9[3];
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          }
          else {
            local_d0.field_2._M_allocated_capacity = *puVar16;
          }
          local_d0._M_string_length = puVar9[1];
          *puVar9 = puVar16;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
          local_70 = (ulong *)*puVar9;
          puVar16 = puVar9 + 2;
          if (local_70 == puVar16) {
            local_60 = *puVar16;
            uStack_58 = puVar9[3];
            local_70 = &local_60;
          }
          else {
            local_60 = *puVar16;
          }
          local_68 = puVar9[1];
          *puVar9 = puVar16;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          pipe_fd[0] = 0x446;
          StreamableToString<int>(&local_f0,pipe_fd);
          uVar24 = 0xf;
          if (local_70 != &local_60) {
            uVar24 = local_60;
          }
          if (uVar24 < local_f0._M_string_length + local_68) {
            uVar23 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              uVar23 = local_f0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar23 < local_f0._M_string_length + local_68) goto LAB_00133713;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_70);
          }
          else {
LAB_00133713:
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)local_f0._M_dataplus._M_p);
          }
          local_50 = (pointer *)*puVar9;
          pppcVar11 = (pointer *)(puVar9 + 2);
          if (local_50 == pppcVar11) {
            local_40 = *pppcVar11;
            lStack_38 = puVar9[3];
            local_50 = &local_40;
          }
          else {
            local_40 = *pppcVar11;
          }
          local_48 = puVar9[1];
          *puVar9 = pppcVar11;
          puVar9[1] = 0;
          *(undefined1 *)pppcVar11 = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
          local_90 = (ulong *)*puVar9;
          puVar16 = puVar9 + 2;
          if (local_90 == puVar16) {
            local_80 = *puVar16;
            lStack_78 = puVar9[3];
            local_90 = &local_80;
          }
          else {
            local_80 = *puVar16;
          }
          local_88 = puVar9[1];
          *puVar9 = puVar16;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar9;
          psVar17 = puVar9 + 2;
          if (paVar18 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar17) goto LAB_00133e38;
          local_b0.field_2._M_allocated_capacity = *psVar17;
          local_b0.field_2._8_8_ = puVar9[3];
          goto LAB_00133e49;
        }
        piVar10 = __errno_location();
      } while (*piVar10 == 4);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CHECK failed: File ","");
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_110._M_dataplus._M_p = (pointer)*plVar8;
      plVar13 = plVar8 + 2;
      if ((long *)local_110._M_dataplus._M_p == plVar13) {
        local_110.field_2._M_allocated_capacity = *plVar13;
        local_110.field_2._8_8_ = plVar8[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *plVar13;
      }
      local_110._M_string_length = plVar8[1];
      *plVar8 = (long)plVar13;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_110);
      local_d0._M_dataplus._M_p = (pointer)*plVar8;
      puVar16 = (ulong *)(plVar8 + 2);
      if ((ulong *)local_d0._M_dataplus._M_p == puVar16) {
        local_d0.field_2._M_allocated_capacity = *puVar16;
        local_d0.field_2._8_8_ = plVar8[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar16;
      }
      local_d0._M_string_length = plVar8[1];
      *plVar8 = (long)puVar16;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      filter_flag.field_2._8_4_ = 0x429;
      StreamableToString<int>((string *)pipe_fd,(int *)(filter_flag.field_2._M_local_buf + 8));
      uVar23 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar23 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar23 < local_128 + local_d0._M_string_length) {
        uVar23 = 0xf;
        if (pipe_fd != (int  [2])&local_120) {
          uVar23 = local_120._M_allocated_capacity;
        }
        if ((ulong)uVar23 < local_128 + local_d0._M_string_length) goto LAB_0013287d;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)pipe_fd,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
      }
      else {
LAB_0013287d:
        puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)pipe_fd);
      }
      local_70 = (ulong *)*puVar9;
      puVar16 = puVar9 + 2;
      if (local_70 == puVar16) {
        local_60 = *puVar16;
        uStack_58 = puVar9[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar16;
      }
      local_68 = puVar9[1];
      *puVar9 = puVar16;
      puVar9[1] = 0;
      *(undefined1 *)puVar16 = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
      local_50 = (pointer *)*puVar9;
      pppcVar11 = (pointer *)(puVar9 + 2);
      if (local_50 == pppcVar11) {
        local_40 = *pppcVar11;
        lStack_38 = puVar9[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *pppcVar11;
      }
      local_48 = puVar9[1];
      *puVar9 = pppcVar11;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (ulong *)*puVar9;
      puVar16 = puVar9 + 2;
      if (local_90 == puVar16) {
        local_80 = *puVar16;
        lStack_78 = puVar9[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *puVar16;
      }
      local_88 = puVar9[1];
      *puVar9 = puVar16;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)*puVar9;
      puVar15 = puVar9 + 2;
      if ((ulong *)local_b0._M_dataplus._M_p == puVar15) {
        local_b0.field_2._M_allocated_capacity = *puVar15;
        local_b0.field_2._8_8_ = puVar9[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *puVar15;
      }
      local_b0._M_string_length = puVar9[1];
      *puVar9 = puVar15;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      DeathTestAbort(&local_b0);
      puVar9 = extraout_RAX;
      paVar18 = extraout_RDX;
      goto LAB_001334e3;
    }
    local_70 = &local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"CHECK failed: File ","");
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
    local_50 = (pointer *)*puVar9;
    pppcVar11 = (pointer *)(puVar9 + 2);
    if (local_50 == pppcVar11) {
      local_40 = *pppcVar11;
      lStack_38 = puVar9[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *pppcVar11;
    }
    local_48 = puVar9[1];
    *puVar9 = pppcVar11;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
    local_90 = (ulong *)*puVar9;
    puVar16 = puVar9 + 2;
    if (local_90 == puVar16) {
      local_80 = *puVar16;
      lStack_78 = puVar9[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *puVar16;
    }
    local_88 = puVar9[1];
    *puVar9 = puVar16;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    local_110._M_dataplus._M_p._0_4_ = 0x46e;
    StreamableToString<int>(&local_d0,(int *)&local_110);
    uVar24 = 0xf;
    if (local_90 != &local_80) {
      uVar24 = local_80;
    }
    if (uVar24 < local_d0._M_string_length + local_88) {
      uVar23 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        uVar23 = local_d0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar23 < local_d0._M_string_length + local_88) goto LAB_001332c9;
      puVar9 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_90);
    }
    else {
LAB_001332c9:
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_d0._M_dataplus._M_p);
    }
    local_b0._M_dataplus._M_p = (pointer)*puVar9;
    puVar16 = puVar9 + 2;
    if ((ulong *)local_b0._M_dataplus._M_p == puVar16) {
      local_b0.field_2._M_allocated_capacity = *puVar16;
      local_b0.field_2._8_8_ = puVar9[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *puVar16;
    }
    local_b0._M_string_length = puVar9[1];
    *puVar9 = puVar16;
    puVar9[1] = 0;
    *(undefined1 *)puVar16 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_310.sa_handler = (__sighandler_t)*plVar8;
    p_Var12 = (__sighandler_t)(plVar8 + 2);
    if (local_310.sa_handler == p_Var12) {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var12;
      ignore_sigprof_action.sa_mask.__val[1] = plVar8[3];
      local_310 = (_union_1457)&ignore_sigprof_action.sa_mask;
    }
    else {
      ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var12;
    }
    ignore_sigprof_action.__sigaction_handler =
         *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar8 + 1);
    *plVar8 = (long)p_Var12;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
    internal_flag.field_2._8_8_ = *puVar9;
    puVar16 = puVar9 + 2;
    if ((ulong *)internal_flag.field_2._8_8_ != puVar16) goto LAB_00133c27;
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar16;
    args_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar9[3];
    internal_flag.field_2._8_8_ =
         &args_1.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  }
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar9[1];
  *puVar9 = puVar16;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  DeathTestAbort((string *)((long)&internal_flag.field_2 + 8));
  puVar9 = extraout_RAX_03;
  local_90 = extraout_RDX_03;
  goto LAB_00133c5b;
LAB_001325b9:
  do {
    iVar7 = close(local_134);
    if (iVar7 != -1) {
      *(int *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x2c = iVar5;
      (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_138;
      (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments((Arguments *)auStack_158);
      if (local_238 != &internal_flag._M_string_length) {
        operator_delete(local_238,internal_flag._M_string_length + 1);
      }
      if (ignore_sigprof_action.sa_restorer != (_func_void *)&filter_flag._M_string_length) {
        operator_delete(ignore_sigprof_action.sa_restorer,filter_flag._M_string_length + 1);
      }
      return OVERSEE_TEST;
    }
    piVar10 = __errno_location();
  } while (*piVar10 == 4);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CHECK failed: File ","");
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
  local_70 = (ulong *)*puVar9;
  puVar16 = puVar9 + 2;
  if (local_70 == puVar16) {
    local_60 = *puVar16;
    uStack_58 = puVar9[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar16;
  }
  local_68 = puVar9[1];
  *puVar9 = puVar16;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (pointer *)*plVar8;
  pppcVar11 = (pointer *)(plVar8 + 2);
  if (local_50 == pppcVar11) {
    local_40 = *pppcVar11;
    lStack_38 = plVar8[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *pppcVar11;
  }
  local_48 = plVar8[1];
  *plVar8 = (long)pppcVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_f0._M_dataplus._M_p._0_4_ = 0x485;
  StreamableToString<int>(&local_110,(int *)&local_f0);
  ppcVar22 = (pointer)0xf;
  if (local_50 != &local_40) {
    ppcVar22 = local_40;
  }
  if (ppcVar22 < (pointer)(local_110._M_string_length + local_48)) {
    uVar23 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      uVar23 = local_110.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar23 < (pointer)(local_110._M_string_length + local_48)) goto LAB_001329d6;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_50);
  }
  else {
LAB_001329d6:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_110._M_dataplus._M_p);
  }
  local_90 = (ulong *)*puVar9;
  puVar16 = puVar9 + 2;
  if (local_90 == puVar16) {
    local_80 = *puVar16;
    lStack_78 = puVar9[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar16;
  }
  local_88 = puVar9[1];
  *puVar9 = puVar16;
  puVar9[1] = 0;
  *(undefined1 *)puVar16 = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)*puVar9;
  puVar16 = puVar9 + 2;
  if ((ulong *)local_b0._M_dataplus._M_p == puVar16) {
    local_b0.field_2._M_allocated_capacity = *puVar16;
    local_b0.field_2._8_8_ = puVar9[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *puVar16;
  }
  local_b0._M_string_length = puVar9[1];
  *puVar9 = puVar16;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_310.sa_handler = (__sighandler_t)*plVar8;
  p_Var12 = (__sighandler_t)(plVar8 + 2);
  if (local_310.sa_handler == p_Var12) {
    ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var12;
    ignore_sigprof_action.sa_mask.__val[1] = plVar8[3];
    local_310 = (_union_1457)&ignore_sigprof_action.sa_mask;
  }
  else {
    ignore_sigprof_action.sa_mask.__val[0] = *(unsigned_long *)p_Var12;
  }
  ignore_sigprof_action.__sigaction_handler =
       *(anon_union_8_2_5ad2d23e_for___sigaction_handler *)(plVar8 + 1);
  *plVar8 = (long)p_Var12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_310);
  internal_flag.field_2._8_8_ =
       &args_1.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  puVar16 = (ulong *)*puVar9;
  puVar15 = puVar9 + 2;
  if (puVar16 != puVar15) goto LAB_00133517;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar15;
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar9[3];
  goto LAB_00133528;
  while (piVar10 = __errno_location(), *piVar10 == 4) {
LAB_00132527:
    iVar7 = sigaction(0x1b,(sigaction *)((long)&internal_flag.field_2 + 8),(sigaction *)0x0);
    if (iVar7 != -1) {
      if (iVar5 != -1) goto LAB_001325b9;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"CHECK failed: File ","")
      ;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
      local_d0._M_dataplus._M_p = (pointer)*puVar9;
      puVar16 = puVar9 + 2;
      if ((ulong *)local_d0._M_dataplus._M_p == puVar16) {
        local_d0.field_2._M_allocated_capacity = *puVar16;
        local_d0.field_2._8_8_ = puVar9[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *puVar16;
      }
      local_d0._M_string_length = puVar9[1];
      *puVar9 = puVar16;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
      local_70 = (ulong *)*puVar9;
      puVar16 = puVar9 + 2;
      if (local_70 == puVar16) {
        local_60 = *puVar16;
        uStack_58 = puVar9[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar16;
      }
      local_68 = puVar9[1];
      *puVar9 = puVar16;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      pipe_fd[0] = 0x456;
      StreamableToString<int>(&local_f0,pipe_fd);
      uVar24 = 0xf;
      if (local_70 != &local_60) {
        uVar24 = local_60;
      }
      if (uVar24 < local_f0._M_string_length + local_68) {
        uVar23 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          uVar23 = local_f0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar23 < local_f0._M_string_length + local_68) goto LAB_0013349a;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_70);
      }
      else {
LAB_0013349a:
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_f0._M_dataplus._M_p)
        ;
      }
      local_50 = (pointer *)*puVar9;
      pppcVar11 = (pointer *)(puVar9 + 2);
      if (local_50 == pppcVar11) {
        local_40 = *pppcVar11;
        lStack_38 = puVar9[3];
        local_50 = &local_40;
      }
      else {
        local_40 = *pppcVar11;
      }
      local_48 = puVar9[1];
      *puVar9 = pppcVar11;
      puVar9[1] = 0;
      *(undefined1 *)pppcVar11 = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_90 = (ulong *)*plVar8;
      puVar16 = (ulong *)(plVar8 + 2);
      if (local_90 == puVar16) {
        local_80 = *puVar16;
        lStack_78 = plVar8[3];
        local_90 = &local_80;
      }
      else {
        local_80 = *puVar16;
      }
      local_88 = plVar8[1];
      *plVar8 = (long)puVar16;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_b0._M_dataplus._M_p = (pointer)*plVar8;
      psVar17 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_b0._M_dataplus._M_p == psVar17) {
        local_b0.field_2._M_allocated_capacity = *psVar17;
        local_b0.field_2._8_8_ = plVar8[3];
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = *psVar17;
      }
      local_b0._M_string_length = plVar8[1];
      *plVar8 = (long)psVar17;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      DeathTestAbort(&local_b0);
      puVar9 = extraout_RAX_04;
      local_b0._M_dataplus._M_p = (pointer)extraout_RDX_04;
      goto LAB_00133dd0;
    }
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CHECK failed: File ","");
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_f0);
  local_110._M_dataplus._M_p = (pointer)*puVar9;
  plVar8 = puVar9 + 2;
  if ((long *)local_110._M_dataplus._M_p == plVar8) {
    local_110.field_2._M_allocated_capacity = *plVar8;
    local_110.field_2._8_8_ = puVar9[3];
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  }
  else {
    local_110.field_2._M_allocated_capacity = *plVar8;
  }
  local_110._M_string_length = puVar9[1];
  *puVar9 = plVar8;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_110);
  local_d0._M_dataplus._M_p = (pointer)*puVar9;
  puVar16 = puVar9 + 2;
  if ((ulong *)local_d0._M_dataplus._M_p == puVar16) {
    local_d0.field_2._M_allocated_capacity = *puVar16;
    local_d0.field_2._8_8_ = puVar9[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *puVar16;
  }
  local_d0._M_string_length = puVar9[1];
  *puVar9 = puVar16;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  filter_flag.field_2._8_4_ = 0x453;
  StreamableToString<int>((string *)pipe_fd,(int *)(filter_flag.field_2._M_local_buf + 8));
  uVar23 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    uVar23 = local_d0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar23 < local_128 + local_d0._M_string_length) {
    uVar23 = 0xf;
    if (pipe_fd != (int  [2])&local_120) {
      uVar23 = local_120._M_allocated_capacity;
    }
    if ((ulong)uVar23 < local_128 + local_d0._M_string_length) goto LAB_00132934;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)pipe_fd,0,(char *)0x0,(ulong)local_d0._M_dataplus._M_p);
  }
  else {
LAB_00132934:
    puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d0,(ulong)pipe_fd);
  }
  local_70 = (ulong *)*puVar9;
  puVar16 = puVar9 + 2;
  if (local_70 == puVar16) {
    local_60 = *puVar16;
    uStack_58 = puVar9[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *puVar16;
  }
  local_68 = puVar9[1];
  *puVar9 = puVar16;
  puVar9[1] = 0;
  *(undefined1 *)puVar16 = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_70);
  local_50 = (pointer *)*puVar9;
  pppcVar11 = (pointer *)(puVar9 + 2);
  if (local_50 == pppcVar11) {
    local_40 = *pppcVar11;
    lStack_38 = puVar9[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *pppcVar11;
  }
  local_48 = puVar9[1];
  *puVar9 = pppcVar11;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (ulong *)*puVar9;
  puVar16 = puVar9 + 2;
  if (local_90 == puVar16) {
    local_80 = *puVar16;
    lStack_78 = puVar9[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar16;
  }
  local_88 = puVar9[1];
  *puVar9 = puVar16;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9;
  puVar15 = puVar9 + 2;
  if (paVar18 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar15) {
    local_b0.field_2._M_allocated_capacity = *puVar15;
    local_b0.field_2._8_8_ = puVar9[3];
  }
  else {
LAB_001334e3:
    local_b0.field_2._M_allocated_capacity = *puVar15;
    local_b0._M_dataplus._M_p = (pointer)paVar18;
  }
  local_b0._M_string_length = puVar9[1];
  *puVar9 = puVar15;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar9 = extraout_RAX_00;
  puVar16 = extraout_RDX_00;
LAB_00133517:
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)*puVar15;
  internal_flag.field_2._8_8_ = puVar16;
LAB_00133528:
  args_1.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar9[1];
  *puVar9 = puVar15;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  DeathTestAbort((string *)((long)&internal_flag.field_2 + 8));
  puVar9 = extraout_RAX_01;
  puVar16 = extraout_RDX_01;
LAB_0013354b:
  local_60 = *puVar15;
  local_70 = puVar16;
LAB_00133556:
  local_68 = puVar9[1];
  *puVar9 = puVar15;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  pipe_fd[0] = 0x435;
  StreamableToString<int>(&local_f0,pipe_fd);
  uVar24 = 0xf;
  if (local_70 != &local_60) {
    uVar24 = local_60;
  }
  if (uVar24 < local_f0._M_string_length + local_68) {
    uVar23 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar23 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar23 < local_f0._M_string_length + local_68) goto LAB_001335d5;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_70);
  }
  else {
LAB_001335d5:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_f0._M_dataplus._M_p);
  }
  local_50 = (pointer *)*puVar9;
  pppcVar11 = (pointer *)(puVar9 + 2);
  if (local_50 == pppcVar11) {
    local_40 = *pppcVar11;
    lStack_38 = puVar9[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *pppcVar11;
  }
  local_48 = puVar9[1];
  *puVar9 = pppcVar11;
  puVar9[1] = 0;
  *(undefined1 *)pppcVar11 = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (ulong *)*puVar9;
  puVar16 = puVar9 + 2;
  if (local_90 == puVar16) {
    local_80 = *puVar16;
    lStack_78 = puVar9[3];
    local_90 = &local_80;
  }
  else {
LAB_00133c5b:
    local_80 = *puVar16;
  }
  local_88 = puVar9[1];
  *puVar9 = puVar16;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
  local_b0._M_dataplus._M_p = (pointer)*puVar9;
  psVar17 = puVar9 + 2;
  if ((size_type *)local_b0._M_dataplus._M_p == psVar17) {
    local_b0.field_2._M_allocated_capacity = *psVar17;
    local_b0.field_2._8_8_ = puVar9[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
LAB_00133dd0:
    local_b0.field_2._M_allocated_capacity = *psVar17;
  }
  local_b0._M_string_length = puVar9[1];
  *puVar9 = psVar17;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar9 = extraout_RAX_05;
  paVar18 = extraout_RDX_05;
LAB_00133e04:
  local_b0.field_2._M_allocated_capacity = *psVar17;
  local_b0._M_dataplus._M_p = (pointer)paVar18;
LAB_00133e15:
  local_b0._M_string_length = puVar9[1];
  *puVar9 = psVar17;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  DeathTestAbort(&local_b0);
  puVar9 = extraout_RAX_06;
  paVar18 = extraout_RDX_06;
LAB_00133e38:
  local_b0.field_2._M_allocated_capacity = *psVar17;
  local_b0._M_dataplus._M_p = (pointer)paVar18;
LAB_00133e49:
  local_b0._M_string_length = puVar9[1];
  *puVar9 = psVar17;
  puVar9[1] = 0;
  *(undefined1 *)(puVar9 + 2) = 0;
  DeathTestAbort(&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,(long)local_40 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  Arguments::~Arguments((Arguments *)auStack_158);
  if (local_238 != &internal_flag._M_string_length) {
    operator_delete(local_238,internal_flag._M_string_length + 1);
  }
  if (ignore_sigprof_action.sa_restorer != (_func_void *)&filter_flag._M_string_length) {
    operator_delete(ignore_sigprof_action.sa_restorer,filter_flag._M_string_length + 1);
  }
  _Unwind_Resume(extraout_RAX_07);
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != NULL) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kFilterFlag + "="
      + info->test_case_name() + "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}